

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O3

LBBox3fa * __thiscall
embree::avx2::LineSegmentsISA::vlinearBounds
          (LBBox3fa *__return_storage_ptr__,LineSegmentsISA *this,Vec3fa *ofs,float scale,
          float r_scale0,LinearSpace3fa *space,size_t primID,BBox1f *time_range)

{
  float fVar1;
  float fVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  char *pcVar7;
  size_t sVar8;
  float fVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  size_t *psVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float r_scale_1;
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar68;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar67;
  float fVar72;
  float fVar73;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar74;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar71;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  
  fVar1 = (this->super_LineSegments).super_Geometry.fnumTimeSegments;
  fVar24 = (this->super_LineSegments).super_Geometry.time_range.lower;
  fVar52 = (this->super_LineSegments).super_Geometry.time_range.upper - fVar24;
  fVar47 = (time_range->lower - fVar24) / fVar52;
  fVar52 = (time_range->upper - fVar24) / fVar52;
  fVar24 = fVar1 * fVar47;
  fVar32 = fVar1 * fVar52;
  auVar54 = vroundss_avx(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24),9);
  auVar56 = vroundss_avx(ZEXT416((uint)fVar32),ZEXT416((uint)fVar32),10);
  auVar25 = vmaxss_avx(auVar54,ZEXT816(0));
  fVar31 = auVar25._0_4_;
  iVar19 = -1;
  if (-1 < (int)auVar54._0_4_) {
    iVar19 = (int)auVar54._0_4_;
  }
  uVar10 = (int)fVar1 + 1U;
  if ((int)auVar56._0_4_ < (int)((int)fVar1 + 1U)) {
    uVar10 = (int)auVar56._0_4_;
  }
  lVar16 = (long)(int)fVar31;
  fVar9 = scale * r_scale0;
  uVar20 = *(uint *)(*(long *)&(this->super_LineSegments).super_Geometry.field_0x58 +
                    primID * *(long *)&(this->super_LineSegments).field_0x68);
  uVar17 = (ulong)uVar20;
  pBVar6 = (this->super_LineSegments).vertices.items;
  pcVar7 = pBVar6[lVar16].super_RawBufferView.ptr_ofs;
  sVar8 = pBVar6[lVar16].super_RawBufferView.stride;
  lVar21 = sVar8 * uVar17;
  uVar18 = (ulong)(uVar20 + 1);
  lVar23 = sVar8 * uVar18;
  aVar3 = ofs->field_0;
  auVar25 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + lVar21),(undefined1  [16])aVar3);
  auVar54._0_4_ = scale * auVar25._0_4_;
  auVar54._4_4_ = scale * auVar25._4_4_;
  auVar54._8_4_ = scale * auVar25._8_4_;
  auVar54._12_4_ = scale * auVar25._12_4_;
  auVar58._4_4_ = auVar54._0_4_;
  auVar58._0_4_ = auVar54._0_4_;
  auVar58._8_4_ = auVar54._0_4_;
  auVar58._12_4_ = auVar54._0_4_;
  auVar25 = vshufps_avx(auVar54,auVar54,0x55);
  auVar54 = vshufps_avx(auVar54,auVar54,0xaa);
  aVar4 = (space->vy).field_0;
  fVar11 = (space->vz).field_0.m128[0];
  fVar12 = (space->vz).field_0.m128[1];
  fVar13 = (space->vz).field_0.m128[2];
  fVar14 = (space->vz).field_0.m128[3];
  auVar44._0_4_ = auVar54._0_4_ * fVar11;
  auVar44._4_4_ = auVar54._4_4_ * fVar12;
  auVar44._8_4_ = auVar54._8_4_ * fVar13;
  auVar44._12_4_ = auVar54._12_4_ * fVar14;
  auVar25 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar4,auVar25);
  aVar5 = (space->vx).field_0;
  auVar54 = vfmadd231ps_fma(auVar25,(undefined1  [16])aVar5,auVar58);
  auVar25 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + lVar23),(undefined1  [16])aVar3);
  auVar59._0_4_ = auVar25._0_4_ * scale;
  auVar59._4_4_ = auVar25._4_4_ * scale;
  auVar59._8_4_ = auVar25._8_4_ * scale;
  auVar59._12_4_ = auVar25._12_4_ * scale;
  auVar25 = vshufps_avx(auVar59,auVar59,0xaa);
  auVar69._0_4_ = auVar25._0_4_ * fVar11;
  auVar69._4_4_ = auVar25._4_4_ * fVar12;
  auVar69._8_4_ = auVar25._8_4_ * fVar13;
  auVar69._12_4_ = auVar25._12_4_ * fVar14;
  auVar25 = vshufps_avx(auVar59,auVar59,0x55);
  auVar25 = vfmadd231ps_fma(auVar69,(undefined1  [16])aVar4,auVar25);
  auVar35._4_4_ = auVar59._0_4_;
  auVar35._0_4_ = auVar59._0_4_;
  auVar35._8_4_ = auVar59._0_4_;
  auVar35._12_4_ = auVar59._0_4_;
  fVar2 = (this->super_LineSegments).maxRadiusScale;
  auVar58 = vfmadd231ps_fma(auVar25,(undefined1  [16])aVar5,auVar35);
  auVar41 = ZEXT416((uint)(fVar2 * *(float *)(pcVar7 + lVar21 + 0xc) * fVar9));
  auVar25 = vinsertps_avx(auVar54,auVar41,0x30);
  auVar59 = ZEXT416((uint)(fVar2 * *(float *)(pcVar7 + lVar23 + 0xc) * fVar9));
  auVar54 = vinsertps_avx(auVar58,auVar59,0x30);
  auVar58 = vminps_avx(auVar25,auVar54);
  auVar25 = vmaxps_avx(auVar25,auVar54);
  auVar54 = vminss_avx(auVar56,ZEXT416((uint)fVar1));
  fVar55 = auVar54._0_4_;
  auVar54 = vmaxss_avx(auVar59,auVar41);
  fVar68 = fVar2 * auVar54._0_4_;
  auVar56._4_4_ = fVar68;
  auVar56._0_4_ = fVar68;
  auVar56._8_4_ = fVar68;
  auVar56._12_4_ = fVar68;
  auVar58 = vsubps_avx(auVar58,auVar56);
  auVar41._0_4_ = auVar25._0_4_ + fVar68;
  auVar41._4_4_ = auVar25._4_4_ + fVar68;
  auVar41._8_4_ = auVar25._8_4_ + fVar68;
  auVar41._12_4_ = auVar25._12_4_ + fVar68;
  lVar21 = (long)(int)fVar55;
  pcVar7 = pBVar6[lVar21].super_RawBufferView.ptr_ofs;
  sVar8 = pBVar6[lVar21].super_RawBufferView.stride;
  lVar22 = sVar8 * uVar17;
  auVar25 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + lVar22),(undefined1  [16])aVar3);
  auVar61._0_4_ = auVar25._0_4_ * scale;
  auVar61._4_4_ = auVar25._4_4_ * scale;
  auVar61._8_4_ = auVar25._8_4_ * scale;
  auVar61._12_4_ = auVar25._12_4_ * scale;
  auVar25 = vshufps_avx(auVar61,auVar61,0xaa);
  auVar70._0_4_ = auVar25._0_4_ * fVar11;
  auVar70._4_4_ = auVar25._4_4_ * fVar12;
  auVar70._8_4_ = auVar25._8_4_ * fVar13;
  auVar70._12_4_ = auVar25._12_4_ * fVar14;
  auVar25 = vshufps_avx(auVar61,auVar61,0x55);
  auVar25 = vfmadd231ps_fma(auVar70,(undefined1  [16])aVar4,auVar25);
  auVar62._4_4_ = auVar61._0_4_;
  auVar62._0_4_ = auVar61._0_4_;
  auVar62._8_4_ = auVar61._0_4_;
  auVar62._12_4_ = auVar61._0_4_;
  auVar54 = vfmadd231ps_fma(auVar25,(undefined1  [16])aVar5,auVar62);
  lVar23 = sVar8 * uVar18;
  auVar25 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + lVar23),(undefined1  [16])aVar3);
  auVar63._0_4_ = auVar25._0_4_ * scale;
  auVar63._4_4_ = auVar25._4_4_ * scale;
  auVar63._8_4_ = auVar25._8_4_ * scale;
  auVar63._12_4_ = auVar25._12_4_ * scale;
  auVar25 = vshufps_avx(auVar63,auVar63,0xaa);
  auVar83._0_4_ = auVar25._0_4_ * fVar11;
  auVar83._4_4_ = auVar25._4_4_ * fVar12;
  auVar83._8_4_ = auVar25._8_4_ * fVar13;
  auVar83._12_4_ = auVar25._12_4_ * fVar14;
  auVar25 = vshufps_avx(auVar63,auVar63,0x55);
  auVar25 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar4,auVar25);
  auVar64._4_4_ = auVar63._0_4_;
  auVar64._0_4_ = auVar63._0_4_;
  auVar64._8_4_ = auVar63._0_4_;
  auVar64._12_4_ = auVar63._0_4_;
  auVar56 = vfmadd231ps_fma(auVar25,(undefined1  [16])aVar5,auVar64);
  auVar59 = ZEXT416((uint)(fVar2 * *(float *)(pcVar7 + lVar22 + 0xc) * fVar9));
  auVar25 = vinsertps_avx(auVar54,auVar59,0x30);
  auVar35 = ZEXT416((uint)(fVar2 * *(float *)(pcVar7 + lVar23 + 0xc) * fVar9));
  auVar54 = vinsertps_avx(auVar56,auVar35,0x30);
  auVar56 = vminps_avx(auVar25,auVar54);
  auVar25 = vmaxps_avx(auVar25,auVar54);
  auVar54 = vmaxss_avx(auVar35,auVar59);
  fVar68 = fVar2 * auVar54._0_4_;
  auVar65._4_4_ = fVar68;
  auVar65._0_4_ = fVar68;
  auVar65._8_4_ = fVar68;
  auVar65._12_4_ = fVar68;
  auVar54 = vsubps_avx(auVar56,auVar65);
  auVar66._0_4_ = auVar25._0_4_ + fVar68;
  auVar66._4_4_ = auVar25._4_4_ + fVar68;
  auVar66._8_4_ = auVar25._8_4_ + fVar68;
  auVar66._12_4_ = auVar25._12_4_ + fVar68;
  if (uVar10 - iVar19 == 1) {
    auVar25 = vmaxss_avx(ZEXT416((uint)(fVar24 - fVar31)),ZEXT816(0) << 0x20);
    fVar24 = auVar25._0_4_;
    fVar1 = 1.0 - fVar24;
    auVar48._0_4_ = auVar54._0_4_ * fVar24;
    auVar48._4_4_ = auVar54._4_4_ * fVar24;
    auVar48._8_4_ = auVar54._8_4_ * fVar24;
    auVar48._12_4_ = auVar54._12_4_ * fVar24;
    auVar33._4_4_ = fVar1;
    auVar33._0_4_ = fVar1;
    auVar33._8_4_ = fVar1;
    auVar33._12_4_ = fVar1;
    aVar3 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd231ps_fma(auVar48,auVar33,auVar58);
    auVar25._0_4_ = auVar66._0_4_ * fVar24;
    auVar25._4_4_ = auVar66._4_4_ * fVar24;
    auVar25._8_4_ = auVar66._8_4_ * fVar24;
    auVar25._12_4_ = auVar66._12_4_ * fVar24;
    aVar4 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd231ps_fma(auVar25,auVar41,auVar33);
    (__return_storage_ptr__->bounds0).lower.field_0 = aVar3;
    (__return_storage_ptr__->bounds0).upper.field_0 = aVar4;
    auVar25 = vmaxss_avx(ZEXT416((uint)(fVar55 - fVar32)),ZEXT816(0) << 0x20);
    fVar24 = auVar25._0_4_;
    fVar1 = 1.0 - fVar24;
    auVar34._0_4_ = auVar58._0_4_ * fVar24;
    auVar34._4_4_ = auVar58._4_4_ * fVar24;
    auVar34._8_4_ = auVar58._8_4_ * fVar24;
    auVar34._12_4_ = auVar58._12_4_ * fVar24;
    auVar27._4_4_ = fVar1;
    auVar27._0_4_ = fVar1;
    auVar27._8_4_ = fVar1;
    auVar27._12_4_ = fVar1;
    aVar71 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar54,auVar27,auVar34);
    auVar26._0_4_ = fVar24 * auVar41._0_4_;
    auVar26._4_4_ = fVar24 * auVar41._4_4_;
    auVar26._8_4_ = fVar24 * auVar41._8_4_;
    auVar26._12_4_ = fVar24 * auVar41._12_4_;
    aVar67 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar66,auVar27,auVar26);
  }
  else {
    pcVar7 = pBVar6[lVar16 + 1].super_RawBufferView.ptr_ofs;
    sVar8 = pBVar6[lVar16 + 1].super_RawBufferView.stride;
    lVar16 = sVar8 * uVar17;
    lVar23 = sVar8 * uVar18;
    auVar25 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + lVar16),(undefined1  [16])aVar3);
    auVar75._0_4_ = auVar25._0_4_ * scale;
    auVar75._4_4_ = auVar25._4_4_ * scale;
    auVar75._8_4_ = auVar25._8_4_ * scale;
    auVar75._12_4_ = auVar25._12_4_ * scale;
    auVar88._4_4_ = auVar75._0_4_;
    auVar88._0_4_ = auVar75._0_4_;
    auVar88._8_4_ = auVar75._0_4_;
    auVar88._12_4_ = auVar75._0_4_;
    auVar25 = vshufps_avx(auVar75,auVar75,0x55);
    auVar56 = vshufps_avx(auVar75,auVar75,0xaa);
    auVar76._0_4_ = fVar11 * auVar56._0_4_;
    auVar76._4_4_ = fVar12 * auVar56._4_4_;
    auVar76._8_4_ = fVar13 * auVar56._8_4_;
    auVar76._12_4_ = fVar14 * auVar56._12_4_;
    auVar25 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar4,auVar25);
    auVar25 = vfmadd231ps_fma(auVar25,(undefined1  [16])aVar5,auVar88);
    auVar44 = ZEXT416((uint)(fVar9 * fVar2 * *(float *)(pcVar7 + lVar16 + 0xc)));
    auVar25 = vinsertps_avx(auVar25,auVar44,0x30);
    auVar56 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + lVar23),(undefined1  [16])aVar3);
    auVar84._0_4_ = auVar56._0_4_ * scale;
    auVar84._4_4_ = auVar56._4_4_ * scale;
    auVar84._8_4_ = auVar56._8_4_ * scale;
    auVar84._12_4_ = auVar56._12_4_ * scale;
    auVar89._4_4_ = auVar84._0_4_;
    auVar89._0_4_ = auVar84._0_4_;
    auVar89._8_4_ = auVar84._0_4_;
    auVar89._12_4_ = auVar84._0_4_;
    auVar56 = vshufps_avx(auVar84,auVar84,0x55);
    auVar59 = vshufps_avx(auVar84,auVar84,0xaa);
    auVar85._0_4_ = fVar11 * auVar59._0_4_;
    auVar85._4_4_ = fVar12 * auVar59._4_4_;
    auVar85._8_4_ = fVar13 * auVar59._8_4_;
    auVar85._12_4_ = fVar14 * auVar59._12_4_;
    auVar56 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar4,auVar56);
    auVar56 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar5,auVar89);
    auVar35 = ZEXT416((uint)(fVar9 * fVar2 * *(float *)(pcVar7 + lVar23 + 0xc)));
    auVar56 = vinsertps_avx(auVar56,auVar35,0x30);
    auVar59 = vminps_avx(auVar25,auVar56);
    auVar25 = vmaxps_avx(auVar25,auVar56);
    auVar56 = vmaxss_avx(auVar35,auVar44);
    fVar68 = fVar2 * auVar56._0_4_;
    auVar36._4_4_ = fVar68;
    auVar36._0_4_ = fVar68;
    auVar36._8_4_ = fVar68;
    auVar36._12_4_ = fVar68;
    auVar35 = vsubps_avx(auVar59,auVar36);
    pcVar7 = pBVar6[lVar21 + -1].super_RawBufferView.ptr_ofs;
    sVar8 = pBVar6[lVar21 + -1].super_RawBufferView.stride;
    lVar16 = sVar8 * uVar17;
    lVar21 = sVar8 * uVar18;
    auVar56 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + lVar16),(undefined1  [16])aVar3);
    auVar37._0_4_ = scale * auVar56._0_4_;
    auVar37._4_4_ = scale * auVar56._4_4_;
    auVar37._8_4_ = scale * auVar56._8_4_;
    auVar37._12_4_ = scale * auVar56._12_4_;
    auVar77._4_4_ = auVar37._0_4_;
    auVar77._0_4_ = auVar37._0_4_;
    auVar77._8_4_ = auVar37._0_4_;
    auVar77._12_4_ = auVar37._0_4_;
    auVar56 = vshufps_avx(auVar37,auVar37,0x55);
    auVar59 = vshufps_avx(auVar37,auVar37,0xaa);
    auVar86._0_4_ = fVar11 * auVar59._0_4_;
    auVar86._4_4_ = fVar12 * auVar59._4_4_;
    auVar86._8_4_ = fVar13 * auVar59._8_4_;
    auVar86._12_4_ = fVar14 * auVar59._12_4_;
    auVar56 = vfmadd231ps_fma(auVar86,(undefined1  [16])aVar4,auVar56);
    auVar44 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar5,auVar77);
    auVar56 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + lVar21),(undefined1  [16])aVar3);
    auVar38._0_4_ = scale * auVar56._0_4_;
    auVar38._4_4_ = scale * auVar56._4_4_;
    auVar38._8_4_ = scale * auVar56._8_4_;
    auVar38._12_4_ = scale * auVar56._12_4_;
    auVar56 = vshufps_avx(auVar38,auVar38,0x55);
    auVar59 = vshufps_avx(auVar38,auVar38,0xaa);
    auVar90._0_4_ = fVar11 * auVar59._0_4_;
    auVar90._4_4_ = fVar12 * auVar59._4_4_;
    auVar90._8_4_ = fVar13 * auVar59._8_4_;
    auVar90._12_4_ = fVar14 * auVar59._12_4_;
    auVar56 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar4,auVar56);
    auVar39._4_4_ = auVar38._0_4_;
    auVar39._0_4_ = auVar38._0_4_;
    auVar39._8_4_ = auVar38._0_4_;
    auVar39._12_4_ = auVar38._0_4_;
    auVar59 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar5,auVar39);
    auVar56 = vmaxss_avx(ZEXT416((uint)(fVar24 - fVar31)),ZEXT816(0) << 0x20);
    fVar31 = auVar56._0_4_;
    fVar24 = 1.0 - fVar31;
    local_88 = auVar35._0_4_;
    fStack_84 = auVar35._4_4_;
    fStack_80 = auVar35._8_4_;
    fStack_7c = auVar35._12_4_;
    auVar78._0_4_ = fVar31 * local_88;
    auVar78._4_4_ = fVar31 * fStack_84;
    auVar78._8_4_ = fVar31 * fStack_80;
    auVar78._12_4_ = fVar31 * fStack_7c;
    auVar49._4_4_ = fVar24;
    auVar49._0_4_ = fVar24;
    auVar49._8_4_ = fVar24;
    auVar49._12_4_ = fVar24;
    auVar60 = vfmadd213ps_fma(auVar58,auVar49,auVar78);
    auVar40._0_4_ = fVar31 * (auVar25._0_4_ + fVar68);
    auVar40._4_4_ = fVar31 * (auVar25._4_4_ + fVar68);
    auVar40._8_4_ = fVar31 * (auVar25._8_4_ + fVar68);
    auVar40._12_4_ = fVar31 * (auVar25._12_4_ + fVar68);
    auVar35 = ZEXT416((uint)(fVar2 * *(float *)(pcVar7 + lVar16 + 0xc) * fVar9));
    auVar25 = vinsertps_avx(auVar44,auVar35,0x30);
    auVar57 = vfmadd213ps_fma(auVar41,auVar49,auVar40);
    auVar41 = ZEXT416((uint)(fVar9 * fVar2 * *(float *)(pcVar7 + lVar21 + 0xc)));
    auVar56 = vinsertps_avx(auVar59,auVar41,0x30);
    auVar58 = vminps_avx(auVar25,auVar56);
    auVar25 = vmaxps_avx(auVar25,auVar56);
    auVar56 = vmaxss_avx(auVar41,auVar35);
    fVar24 = fVar2 * auVar56._0_4_;
    auVar42._4_4_ = fVar24;
    auVar42._0_4_ = fVar24;
    auVar42._8_4_ = fVar24;
    auVar42._12_4_ = fVar24;
    auVar58 = vsubps_avx(auVar58,auVar42);
    auVar56 = vmaxss_avx(ZEXT416((uint)(fVar55 - fVar32)),ZEXT816(0) << 0x20);
    fVar31 = auVar56._0_4_;
    fVar32 = 1.0 - fVar31;
    auVar79._0_4_ = auVar58._0_4_ * fVar31;
    auVar79._4_4_ = auVar58._4_4_ * fVar31;
    auVar79._8_4_ = auVar58._8_4_ * fVar31;
    auVar79._12_4_ = auVar58._12_4_ * fVar31;
    auVar87._4_4_ = fVar32;
    auVar87._0_4_ = fVar32;
    auVar87._8_4_ = fVar32;
    auVar87._12_4_ = fVar32;
    aVar71 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar54,auVar87,auVar79);
    auVar43._0_4_ = fVar31 * (auVar25._0_4_ + fVar24);
    auVar43._4_4_ = fVar31 * (auVar25._4_4_ + fVar24);
    auVar43._8_4_ = fVar31 * (auVar25._8_4_ + fVar24);
    auVar43._12_4_ = fVar31 * (auVar25._12_4_ + fVar24);
    aVar67 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar66,auVar87,auVar43);
    uVar20 = iVar19 + 1;
    if ((int)uVar20 < (int)uVar10) {
      psVar15 = &pBVar6[uVar20].super_RawBufferView.stride;
      auVar25 = auVar57;
      auVar54 = auVar60;
      do {
        pcVar7 = ((RawBufferView *)(psVar15 + -2))->ptr_ofs;
        lVar16 = *psVar15 * uVar17;
        lVar21 = *psVar15 * uVar18;
        auVar56 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + lVar16),(undefined1  [16])aVar3);
        fVar32 = ((float)(int)uVar20 / fVar1 - fVar47) / (fVar52 - fVar47);
        auVar50._0_4_ = scale * auVar56._0_4_;
        auVar50._4_4_ = scale * auVar56._4_4_;
        auVar50._8_4_ = scale * auVar56._8_4_;
        auVar50._12_4_ = scale * auVar56._12_4_;
        auVar28._4_4_ = auVar50._0_4_;
        auVar28._0_4_ = auVar50._0_4_;
        auVar28._8_4_ = auVar50._0_4_;
        auVar28._12_4_ = auVar50._0_4_;
        auVar56 = vshufps_avx(auVar50,auVar50,0x55);
        auVar58 = vshufps_avx(auVar50,auVar50,0xaa);
        auVar51._0_4_ = fVar11 * auVar58._0_4_;
        auVar51._4_4_ = fVar12 * auVar58._4_4_;
        auVar51._8_4_ = fVar13 * auVar58._8_4_;
        auVar51._12_4_ = fVar14 * auVar58._12_4_;
        auVar58 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar4,auVar56);
        auVar56 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + lVar21),(undefined1  [16])aVar3);
        auVar80._0_4_ = auVar56._0_4_ * scale;
        auVar80._4_4_ = auVar56._4_4_ * scale;
        auVar80._8_4_ = auVar56._8_4_ * scale;
        auVar80._12_4_ = auVar56._12_4_ * scale;
        auVar41 = vfmadd231ps_fma(auVar58,(undefined1  [16])aVar5,auVar28);
        auVar29._4_4_ = auVar80._0_4_;
        auVar29._0_4_ = auVar80._0_4_;
        auVar29._8_4_ = auVar80._0_4_;
        auVar29._12_4_ = auVar80._0_4_;
        auVar56 = vshufps_avx(auVar80,auVar80,0x55);
        auVar58 = vshufps_avx(auVar80,auVar80,0xaa);
        fVar24 = 1.0 - fVar32;
        auVar81._0_4_ = fVar11 * auVar58._0_4_;
        auVar81._4_4_ = fVar12 * auVar58._4_4_;
        auVar81._8_4_ = fVar13 * auVar58._8_4_;
        auVar81._12_4_ = fVar14 * auVar58._12_4_;
        auVar56 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar4,auVar56);
        auVar58 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar5,auVar29);
        auVar61 = ZEXT416((uint)(fVar2 * *(float *)(pcVar7 + lVar16 + 0xc) * fVar9));
        auVar56 = vinsertps_avx(auVar41,auVar61,0x30);
        auVar44 = ZEXT416((uint)(fVar9 * fVar2 * *(float *)(pcVar7 + lVar21 + 0xc)));
        auVar58 = vinsertps_avx(auVar58,auVar44,0x30);
        auVar41 = vminps_avx(auVar56,auVar58);
        auVar56 = vmaxps_avx(auVar56,auVar58);
        auVar82._0_4_ = aVar71.m128[0] * fVar32;
        fVar72 = aVar71.m128[1];
        auVar82._4_4_ = fVar72 * fVar32;
        fVar73 = aVar71.m128[2];
        auVar82._8_4_ = fVar73 * fVar32;
        fVar74 = aVar71.m128[3];
        auVar82._12_4_ = fVar74 * fVar32;
        auVar53._4_4_ = fVar24;
        auVar53._0_4_ = fVar24;
        auVar53._8_4_ = fVar24;
        auVar53._12_4_ = fVar24;
        auVar59 = vfmadd231ps_fma(auVar82,auVar53,auVar54);
        auVar30._0_4_ = aVar67.m128[0] * fVar32;
        fVar31 = aVar67.m128[1];
        auVar30._4_4_ = fVar31 * fVar32;
        fVar68 = aVar67.m128[2];
        auVar30._8_4_ = fVar68 * fVar32;
        fVar55 = aVar67.m128[3];
        auVar30._12_4_ = fVar55 * fVar32;
        auVar35 = vfmadd231ps_fma(auVar30,auVar25,auVar53);
        auVar58 = vmaxss_avx(auVar44,auVar61);
        fVar24 = fVar2 * auVar58._0_4_;
        auVar45._4_4_ = fVar24;
        auVar45._0_4_ = fVar24;
        auVar45._8_4_ = fVar24;
        auVar45._12_4_ = fVar24;
        auVar58 = vsubps_avx(auVar41,auVar45);
        auVar58 = vsubps_avx(auVar58,auVar59);
        auVar46._0_4_ = auVar56._0_4_ + fVar24;
        auVar46._4_4_ = auVar56._4_4_ + fVar24;
        auVar46._8_4_ = auVar56._8_4_ + fVar24;
        auVar46._12_4_ = auVar56._12_4_ + fVar24;
        auVar41 = vsubps_avx(auVar46,auVar35);
        auVar56 = vminps_avx(auVar58,ZEXT816(0) << 0x20);
        auVar60._0_4_ = auVar54._0_4_ + auVar56._0_4_;
        auVar60._4_4_ = auVar54._4_4_ + auVar56._4_4_;
        auVar60._8_4_ = auVar54._8_4_ + auVar56._8_4_;
        auVar60._12_4_ = auVar54._12_4_ + auVar56._12_4_;
        aVar71._0_4_ = aVar71.m128[0] + auVar56._0_4_;
        aVar71._4_4_ = fVar72 + auVar56._4_4_;
        aVar71._8_4_ = fVar73 + auVar56._8_4_;
        aVar71._12_4_ = fVar74 + auVar56._12_4_;
        auVar54 = vmaxps_avx(auVar41,ZEXT816(0) << 0x20);
        auVar57._0_4_ = auVar25._0_4_ + auVar54._0_4_;
        auVar57._4_4_ = auVar25._4_4_ + auVar54._4_4_;
        auVar57._8_4_ = auVar25._8_4_ + auVar54._8_4_;
        auVar57._12_4_ = auVar25._12_4_ + auVar54._12_4_;
        aVar67._0_4_ = aVar67.m128[0] + auVar54._0_4_;
        aVar67._4_4_ = fVar31 + auVar54._4_4_;
        aVar67._8_4_ = fVar68 + auVar54._8_4_;
        aVar67._12_4_ = fVar55 + auVar54._12_4_;
        uVar20 = uVar20 + 1;
        psVar15 = psVar15 + 7;
        auVar25 = auVar57;
        auVar54 = auVar60;
      } while (uVar10 != uVar20);
    }
    *(undefined1 (*) [16])(__return_storage_ptr__->bounds0).lower.field_0.m128 = auVar60;
    *(undefined1 (*) [16])(__return_storage_ptr__->bounds0).upper.field_0.m128 = auVar57;
  }
  (__return_storage_ptr__->bounds1).lower.field_0 = aVar71;
  (__return_storage_ptr__->bounds1).upper.field_0 = aVar67;
  return __return_storage_ptr__;
}

Assistant:

__forceinline LBBox3fa linearBounds(const Vec3fa& ofs, const float scale, const float r_scale0, const LinearSpace3fa& space, size_t primID, const BBox1f& dt) const {
      return LBBox3fa([&] (size_t itime) { return bounds(ofs, scale, r_scale0, space, primID, itime); }, dt, this->time_range, fnumTimeSegments);
    }